

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O3

int testSpanTestsIterationMultipleDims(void)

{
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  undefined4 *puVar7;
  int *piVar8;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> *pIVar9;
  pointer ptVar10;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  vector<int,_std::allocator<int>_> values;
  vector<int,_std::allocator<int>_> expectedRowSums;
  Span<const_int,_18446744073709551615UL> span2d;
  Span<const_int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> local_100;
  vector<int,_std::allocator<int>_> local_e8;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator> local_d0;
  Span<const_int,_18446744073709551615UL> local_b0;
  IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
  local_a0 [3];
  Span<const_int,_18446744073709551615UL> local_40;
  
  puVar7 = &DAT_0032861c;
  pIVar9 = local_a0;
  for (lVar5 = 0x18; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined4 *)&(pIVar9->m_begin).m_ptr = *puVar7;
    puVar7 = puVar7 + 1;
    pIVar9 = (IteratorProvider<MILBlob::Util::Span<const_int,_18446744073709551615UL>::SliceIterator>
              *)((long)&(pIVar9->m_begin).m_ptr + 4);
  }
  __l._M_len = 0x18;
  __l._M_array = (iterator)local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_100,__l,(allocator_type *)&local_d0);
  local_a0[0].m_begin.m_ptr = (pointer)0x1a0000000a;
  local_a0[0].m_begin.m_stride._0_4_ = 0x2a;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_a0;
  std::vector<int,_std::allocator<int>_>::vector(&local_e8,__l_00,(allocator_type *)&local_d0);
  local_40.m_ptr = (pointer)0x0;
  if ((long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    local_40.m_ptr =
         local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_40.m_size.m_size =
       (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish -
       (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start >> 2;
  MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices
            (local_a0,&local_40,local_40.m_size.m_size >> 1);
  uVar2 = CONCAT44(local_a0[0].m_begin.m_stride._4_4_,(undefined4)local_a0[0].m_begin.m_stride);
  iVar6 = 0;
  if (local_a0[0].m_begin.m_ptr != local_a0[0].m_end.m_ptr ||
      (local_a0[0].m_end.m_stride ^ uVar2) != 0) {
    ptVar10 = local_a0[0].m_begin.m_ptr;
    do {
      local_b0.m_ptr = ptVar10;
      if (uVar2 == 0) {
        local_b0.m_ptr = (pointer)0x0;
      }
      local_b0.m_size.m_size = uVar2;
      if (uVar2 != 0xc) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                   ,0x71);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x281);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"(span2d.Size()) == (size_t(12))",0x1f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
LAB_001c11b4:
        iVar6 = 1;
        break;
      }
      MILBlob::Util::Span<const_int,_18446744073709551615UL>::IterateSlices(&local_d0,&local_b0,4);
      if (local_d0.m_begin.m_ptr != local_d0.m_end.m_ptr ||
          (local_d0.m_end.m_stride ^ local_d0.m_begin.m_stride) != 0) {
        piVar8 = local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar1 = local_d0.m_begin.m_ptr;
        if (local_d0.m_begin.m_stride != 4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                     ,0x71);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x285);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"(row.Size()) == (size_t(4))",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          goto LAB_001c11b4;
        }
        do {
          piVar3 = piVar1 + 4;
          if (piVar1[3] + piVar1[1] + piVar1[2] + *piVar1 != *piVar8) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                       ,0x71);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x28c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"(sum) == (expectedRowSums[rowIndex++])",0x26);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4," was false, expected true.",0x1a);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            goto LAB_001c11b4;
          }
          piVar8 = piVar8 + 1;
          piVar1 = piVar3;
        } while (piVar3 != local_d0.m_end.m_ptr ||
                 (local_d0.m_end.m_stride ^ local_d0.m_begin.m_stride) != 0);
      }
      ptVar10 = ptVar10 + 0xc;
      iVar6 = 0;
    } while (ptVar10 != local_a0[0].m_end.m_ptr || (local_a0[0].m_end.m_stride ^ uVar2) != 0);
  }
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar6;
}

Assistant:

int testSpanTestsIterationMultipleDims()
{
    // clang-format off
    const std::vector<int> values = {
        // shape: [2, 3, 4]
        /*0*/
        1, 2, 3, 4,
        5, 6, 7, 8,
        9, 10, 11, 12,
        /*1*/
        1, 2, 3, 4,
        5, 6, 7, 8,
        9, 10, 11, 12
    };
    // clang-format on

    const std::vector<int> expectedRowSums = {10, 26, 42};

    auto span = MakeSpan(values);

    for (auto span2d : span.IterateByDimension(2)) {
        ML_ASSERT_EQ(span2d.Size(), size_t(12));

        size_t rowIndex = 0;
        for (auto row : span2d.IterateByDimension(3)) {
            ML_ASSERT_EQ(row.Size(), size_t(4));

            int sum = 0;
            for (auto i : row) {
                sum += i;
            }

            ML_ASSERT_EQ(sum, expectedRowSums[rowIndex++]);
        }
    }

    return 0;
}